

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_nonce_function_bip340_sha256_tagged_aux(secp256k1_sha256 *sha)

{
  secp256k1_sha256 *in_RDI;
  
  secp256k1_sha256_initialize(in_RDI);
  in_RDI->s[0] = 0x24dd3219;
  in_RDI->s[1] = 0x4eba7e70;
  in_RDI->s[2] = 0xca0fabb9;
  in_RDI->s[3] = 0xfa3166d;
  in_RDI->s[4] = 0x3afbe4b1;
  in_RDI->s[5] = 0x4c44df97;
  in_RDI->s[6] = 0x4aac2739;
  in_RDI->s[7] = 0x249e850a;
  in_RDI->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_nonce_function_bip340_sha256_tagged_aux(secp256k1_sha256 *sha) {
    secp256k1_sha256_initialize(sha);
    sha->s[0] = 0x24dd3219ul;
    sha->s[1] = 0x4eba7e70ul;
    sha->s[2] = 0xca0fabb9ul;
    sha->s[3] = 0x0fa3166dul;
    sha->s[4] = 0x3afbe4b1ul;
    sha->s[5] = 0x4c44df97ul;
    sha->s[6] = 0x4aac2739ul;
    sha->s[7] = 0x249e850aul;

    sha->bytes = 64;
}